

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.h
# Opt level: O2

void __thiscall duckdb_skiplistlib::skip_list::Exception::Exception(Exception *this,string *in_msg)

{
  *(undefined ***)this = &PTR__Exception_017b1ba0;
  std::__cxx11::string::string((string *)&this->msg,(string *)in_msg);
  return;
}

Assistant:

explicit Exception(const std::string &in_msg) : msg(in_msg) {}